

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int hdr_value_at_percentiles(hdr_histogram *h,double *percentiles,int64_t *values,size_t length)

{
  int64_t value;
  _Bool _Var1;
  int iVar2;
  size_t i;
  size_t sVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  hdr_iter iter;
  
  if (values == (int64_t *)0x0 || percentiles == (double *)0x0) {
    iVar2 = 0x16;
  }
  else {
    lVar6 = h->total_count;
    for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
      dVar8 = percentiles[sVar3];
      if (100.0 <= dVar8) {
        dVar8 = 100.0;
      }
      lVar5 = (long)((dVar8 / 100.0) * (double)lVar6 + 0.5);
      if (lVar5 < 2) {
        lVar5 = 1;
      }
      values[sVar3] = lVar5;
    }
    iter.counts_index = -1;
    iter.total_count = h->total_count;
    iter.count = 0;
    iter.cumulative_count = 0;
    iter.value = 0;
    iter.highest_equivalent_value = 0;
    iter.value_iterated_from = 0;
    iter.value_iterated_to = 0;
    iter._next_fp = all_values_iter_next;
    lVar6 = 0;
    uVar7 = 0;
    iter.h = h;
    while ((_Var1 = (*iter._next_fp)(&iter), value = iter.value, uVar7 < length && (_Var1))) {
      lVar6 = lVar6 + iter.count;
      for (; (uVar7 < length && (values[uVar7] <= lVar6)); uVar7 = uVar7 + 1) {
        iVar4 = highest_equivalent_value(h,value);
        values[uVar7] = iVar4;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int hdr_value_at_percentiles(const struct hdr_histogram *h, const double *percentiles, int64_t *values, size_t length)
{
    if (NULL == percentiles || NULL == values)
    {
        return EINVAL;
    }

    struct hdr_iter iter;
    const int64_t total_count = h->total_count;
    // to avoid allocations we use the values array for intermediate computation
    // i.e. to store the expected cumulative count at each percentile
    for (size_t i = 0; i < length; i++)
    {
        const double requested_percentile = percentiles[i] < 100.0 ? percentiles[i] : 100.0;
        const int64_t count_at_percentile =
        (int64_t) (((requested_percentile / 100) * total_count) + 0.5);
        values[i] = count_at_percentile > 1 ? count_at_percentile : 1;
    }

    hdr_iter_init(&iter, h);
    int64_t total = 0;
    size_t at_pos = 0;
    while (hdr_iter_next(&iter) && at_pos < length)
    {
        total += iter.count;
        while (at_pos < length && total >= values[at_pos])
        {
            values[at_pos] = highest_equivalent_value(h, iter.value);
            at_pos++;
        }
    }
    return 0;
}